

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void sha256_done(sha256_ctx *ctx,sha256 *res)

{
  beint32_t bVar1;
  ulong local_28;
  size_t i;
  uint64_t sizedesc;
  sha256 *res_local;
  sha256_ctx *ctx_local;
  
  sizedesc = (uint64_t)res;
  res_local = (sha256 *)ctx;
  i = cpu_to_be64(ctx->bytes << 3);
  add((sha256_ctx *)res_local,sha256_done::pad,
      (0x77 - (*(ulong *)&res_local[3].u & 0x3f) & 0x3f) + 1);
  add((sha256_ctx *)res_local,&i,8);
  for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
    bVar1 = cpu_to_be32((res_local->u).u32[local_28]);
    *(beint32_t *)(sizedesc + local_28 * 4) = bVar1;
  }
  invalidate_sha256((sha256_ctx *)res_local);
  return;
}

Assistant:

void sha256_done(struct sha256_ctx *ctx, struct sha256 *res)
{
	static const unsigned char pad[64] = {0x80};
	uint64_t sizedesc;
	size_t i;

	sizedesc = cpu_to_be64((uint64_t)ctx->bytes << 3);
	/* Add '1' bit to terminate, then all 0 bits, up to next block - 8. */
	add(ctx, pad, 1 + ((128 - 8 - (ctx->bytes % 64) - 1) % 64));
	/* Add number of bits of data (big endian) */
	add(ctx, &sizedesc, 8);
	for (i = 0; i < sizeof(ctx->s) / sizeof(ctx->s[0]); i++)
		res->u.u32[i] = cpu_to_be32(ctx->s[i]);
	invalidate_sha256(ctx);
}